

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_dynlight1.cpp
# Opt level: O0

bool gl_GetLight(int group,Plane *p,ADynamicLight *light,bool checkside,FDynLightData *ldata)

{
  bool bVar1;
  byte bVar2;
  uint uVar3;
  float *pfVar4;
  long lVar5;
  float fVar6;
  float fVar7;
  float *data;
  Vector v;
  float b;
  float g;
  float r;
  float cs;
  float radius;
  float dist;
  DVector3 pos;
  int i;
  FDynLightData *ldata_local;
  bool checkside_local;
  ADynamicLight *light_local;
  Plane *p_local;
  int group_local;
  
  pos.Z._4_4_ = 0;
  AActor::PosRelative((DVector3 *)&radius,&light->super_AActor,group);
  fVar6 = Plane::DistToPoint(p,(float)_radius,(float)pos.Y,(float)pos.X);
  fVar7 = ADynamicLight::GetRadius(light);
  if (0.0 < fVar7) {
    if (ABS(fVar6) <= fVar7) {
      if (((checkside) && (bVar1 = FBoolCVar::operator_cast_to_bool(&gl_lights_checkside), bVar1))
         && (bVar1 = Plane::PointOnSide(p,(float)_radius,(float)pos.Y,(float)pos.X), bVar1)) {
        p_local._7_1_ = false;
      }
      else {
        bVar1 = ADynamicLight::IsAdditive(light);
        if (bVar1) {
          g = 0.2;
          pos.Z._4_4_ = 2;
        }
        else {
          g = 1.0;
        }
        bVar2 = ADynamicLight::GetRed(light);
        b = ((float)bVar2 / 255.0) * g;
        bVar2 = ADynamicLight::GetGreen(light);
        v.m_length = ((float)bVar2 / 255.0) * g;
        bVar2 = ADynamicLight::GetBlue(light);
        v.m_vec[2] = ((float)bVar2 / 255.0) * g;
        bVar1 = ADynamicLight::IsSubtractive(light);
        if (bVar1) {
          Vector::Vector((Vector *)&data);
          Vector::Set((Vector *)&data,b,v.m_length,v.m_vec[2]);
          fVar6 = Vector::Length((Vector *)&data);
          b = fVar6 - b;
          fVar6 = Vector::Length((Vector *)&data);
          v.m_length = fVar6 - v.m_length;
          fVar6 = Vector::Length((Vector *)&data);
          v.m_vec[2] = fVar6 - v.m_vec[2];
          pos.Z._4_4_ = 1;
        }
        lVar5 = (long)pos.Z._4_4_;
        uVar3 = TArray<float,_float>::Reserve(ldata->arrays + pos.Z._4_4_,8);
        pfVar4 = TArray<float,_float>::operator[](ldata->arrays + lVar5,(ulong)uVar3);
        *pfVar4 = (float)_radius;
        pfVar4[1] = (float)pos.Y;
        pfVar4[2] = (float)pos.X;
        pfVar4[3] = fVar7;
        pfVar4[4] = b;
        pfVar4[5] = v.m_length;
        pfVar4[6] = v.m_vec[2];
        pfVar4[7] = 0.0;
        p_local._7_1_ = true;
      }
    }
    else {
      p_local._7_1_ = false;
    }
  }
  else {
    p_local._7_1_ = false;
  }
  return p_local._7_1_;
}

Assistant:

bool gl_GetLight(int group, Plane & p, ADynamicLight * light, bool checkside, FDynLightData &ldata)
{
	int i = 0;

	DVector3 pos = light->PosRelative(group);
	
	float dist = fabsf(p.DistToPoint(pos.X, pos.Z, pos.Y));
	float radius = (light->GetRadius());
	
	if (radius <= 0.f) return false;
	if (dist > radius) return false;
	if (checkside && gl_lights_checkside && p.PointOnSide(pos.X, pos.Z, pos.Y))
	{
		return false;
	}


	float cs;
	if (light->IsAdditive()) 
	{
		cs = 0.2f;
		i = 2;
	}
	else 
	{
		cs = 1.0f;
	}

	float r = light->GetRed() / 255.0f * cs;
	float g = light->GetGreen() / 255.0f * cs;
	float b = light->GetBlue() / 255.0f * cs;

	if (light->IsSubtractive())
	{
		Vector v;
		
		v.Set(r, g, b);
		r = v.Length() - r;
		g = v.Length() - g;
		b = v.Length() - b;
		i = 1;
	}

	float *data = &ldata.arrays[i][ldata.arrays[i].Reserve(8)];
	data[0] = pos.X;
	data[1] = pos.Z;
	data[2] = pos.Y;
	data[3] = radius;
	data[4] = r;
	data[5] = g;
	data[6] = b;
	data[7] = 0;
	return true;
}